

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_oneof.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::OneofGenerator::OneofGenerator
          (OneofGenerator *this,OneofDescriptor *descriptor)

{
  bool bVar1;
  mapped_type *pmVar2;
  char *pcVar3;
  undefined1 in_CL;
  int __c;
  OneofDescriptor *descriptor_00;
  OneofDescriptor *descriptor_01;
  OneofDescriptor *descriptor_02;
  AlphaNum *a;
  Descriptor *descriptor_03;
  string *__s;
  allocator local_291;
  key_type local_290;
  string local_270;
  undefined1 local_250 [8];
  SourceLocation location;
  string comments;
  key_type local_1c0;
  string local_1a0;
  Descriptor *local_180;
  Descriptor *msg_descriptor;
  key_type local_170;
  AlphaNum local_150;
  string local_120;
  allocator local_f9;
  key_type local_f8;
  string local_d8;
  allocator local_b1;
  key_type local_b0;
  string local_90;
  allocator local_69;
  key_type local_68;
  string local_38;
  OneofDescriptor *local_18;
  OneofDescriptor *descriptor_local;
  OneofGenerator *this_local;
  
  this->descriptor_ = descriptor;
  local_18 = descriptor;
  descriptor_local = (OneofDescriptor *)this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->variables_);
  OneofEnumName_abi_cxx11_(&local_38,(objectivec *)this->descriptor_,descriptor_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"enum_name",&local_69);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_68);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_38);
  OneofName_abi_cxx11_(&local_90,(objectivec *)this->descriptor_,descriptor_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"name",&local_b1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_b0);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string((string *)&local_90);
  OneofNameCapitalized_abi_cxx11_(&local_d8,(objectivec *)this->descriptor_,descriptor_02);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"capitalized_name",&local_f9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_f8);
  __s = &local_d8;
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string((string *)&local_d8);
  pcVar3 = OneofDescriptor::index(this->descriptor_,(char *)__s,__c);
  strings::AlphaNum::AlphaNum(&local_150,(int)pcVar3);
  StrCat_abi_cxx11_(&local_120,(protobuf *)&local_150,a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_170,"raw_index",(allocator *)((long)&msg_descriptor + 7));
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_170);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)((long)&msg_descriptor + 7));
  std::__cxx11::string::~string((string *)&local_120);
  local_180 = OneofDescriptor::containing_type(this->descriptor_);
  ClassName_abi_cxx11_(&local_1a0,(objectivec *)local_180,descriptor_03);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1c0,"owning_message_class",
             (allocator *)(comments.field_2._M_local_buf + 0xf));
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_1c0);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)(comments.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::string
            ((string *)
             &location.leading_detached_comments.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  SourceLocation::SourceLocation((SourceLocation *)local_250);
  bVar1 = OneofDescriptor::GetSourceLocation(this->descriptor_,(SourceLocation *)local_250);
  if (bVar1) {
    BuildCommentsString_abi_cxx11_
              (&local_270,(objectivec *)local_250,(SourceLocation *)0x1,(bool)in_CL);
    std::__cxx11::string::operator=
              ((string *)
               &location.leading_detached_comments.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
  }
  else {
    std::__cxx11::string::operator=
              ((string *)
               &location.leading_detached_comments.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_290,"comments",&local_291);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_290);
  std::__cxx11::string::operator=
            ((string *)pmVar2,
             (string *)
             &location.leading_detached_comments.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  SourceLocation::~SourceLocation((SourceLocation *)local_250);
  std::__cxx11::string::~string
            ((string *)
             &location.leading_detached_comments.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

OneofGenerator::OneofGenerator(const OneofDescriptor* descriptor)
    : descriptor_(descriptor) {
  variables_["enum_name"] = OneofEnumName(descriptor_);
  variables_["name"] = OneofName(descriptor_);
  variables_["capitalized_name"] = OneofNameCapitalized(descriptor_);
  variables_["raw_index"] = StrCat(descriptor_->index());
  const Descriptor* msg_descriptor = descriptor_->containing_type();
  variables_["owning_message_class"] = ClassName(msg_descriptor);

  std::string comments;
  SourceLocation location;
  if (descriptor_->GetSourceLocation(&location)) {
    comments = BuildCommentsString(location, true);
  } else {
    comments = "";
  }
  variables_["comments"] = comments;
}